

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_1;
  int i;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  size_type last_bucket_count;
  int last_element;
  size_type empty_bucket_count;
  bool *in_stack_fffffffffffffe88;
  AssertionResult *in_stack_fffffffffffffe90;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe98;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  char *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  AssertHelper *in_stack_fffffffffffffec0;
  AssertionResult local_128;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  value_type *in_stack_ffffffffffffff08;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffff10;
  int local_dc;
  string local_d8 [55];
  undefined1 local_a1;
  AssertionResult local_a0 [2];
  size_type local_80;
  AssertionResult local_78;
  int *local_68;
  char local_28 [20];
  int local_14;
  size_type local_10;
  
  bVar1 = google::
          HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::supports_clear_no_resize
                    ((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    local_10 = google::
               BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xbad74c);
    local_14 = 1;
    while (sVar2 = google::
                   BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ::bucket_count((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xbad76d), sVar2 == local_10) {
      in_stack_fffffffffffffea8 = (char *)(in_RDI + 0x10);
      in_stack_fffffffffffffeb0 = local_28;
      HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueObject(in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
      google::
      BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xbad7cb)
      ;
      local_14 = local_14 + 1;
    }
    local_68 = (int *)google::
                      BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      ::bucket_count((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                                      *)0xbad812);
    google::
    HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::clear_no_resize((HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                       *)0xbad828);
    local_80 = google::
               BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xbad836);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               (unsigned_long *)in_stack_fffffffffffffe98,(unsigned_long *)in_stack_fffffffffffffe90
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffea0 =
           testing::AssertionResult::failure_message((AssertionResult *)0xbad89d);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffec0,(Type)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffeb0,
                 (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
      testing::Message::~Message((Message *)0xbad8fa);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbad968);
    local_a1 = google::
               BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::empty((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)0xbad976);
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(type *)0xbad998);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffec0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffec0,(Type)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffeb0,
                 (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
      std::__cxx11::string::~string(local_d8);
      testing::Message::~Message((Message *)0xbada6b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbadb02);
    for (local_dc = 1; local_dc < local_14; local_dc = local_dc + 1) {
      this_00 = (AssertHelper *)(in_RDI + 0x10);
      this_01 = (HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 *)&stack0xffffffffffffff10;
      HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
      google::
      BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xbadb77)
      ;
      google::
      BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::bucket_count((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbadb85);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,(unsigned_long *)this_01,
                 (unsigned_long *)this_00);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffec0);
        testing::AssertionResult::failure_message((AssertionResult *)0xbadc12);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffec0,(Type)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffeb0
                   ,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xbadc5e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xbadcc0);
    }
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ClearNoResize) {
  if (!this->ht_.supports_clear_no_resize()) return;
  typename TypeParam::size_type empty_bucket_count = this->ht_.bucket_count();
  int last_element = 1;
  while (this->ht_.bucket_count() == empty_bucket_count) {
    this->ht_.insert(this->UniqueObject(last_element));
    ++last_element;
  }
  typename TypeParam::size_type last_bucket_count = this->ht_.bucket_count();
  this->ht_.clear_no_resize();
  EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  EXPECT_TRUE(this->ht_.empty());

  // When inserting the same number of elements again, no resize
  // should be necessary.
  for (int i = 1; i < last_element; ++i) {
    this->ht_.insert(this->UniqueObject(last_element + i));
    EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  }
}